

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O1

void fill_inverse_cmap(j_decompress_ptr cinfo,int c0,int c1,int c2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  _func_void_j_decompress_ptr *p_Var4;
  JSAMPARRAY ppJVar5;
  JSAMPROW pJVar6;
  JSAMPROW pJVar7;
  JSAMPROW pJVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  uint uVar31;
  byte *pbVar32;
  ulong uVar33;
  long *plVar34;
  ulong uVar35;
  ulong uVar36;
  byte *pbVar37;
  uint uVar38;
  long lVar39;
  ulong uVar40;
  bool bVar41;
  JSAMPLE colorlist [256];
  INT32 mindist [256];
  int local_9e8;
  byte local_9b8 [128];
  byte abStack_938 [256];
  long local_838 [257];
  
  p_Var4 = cinfo->cquantize[1].finish_pass;
  uVar12 = c0 * 8;
  uVar28 = (long)(int)uVar12 & 0xffffffffffffffe0U | 4;
  uVar13 = c1 * 4;
  uVar30 = (long)(int)uVar13 & 0xffffffffffffffe0U | 2;
  uVar14 = c2 * 8;
  uVar15 = (long)(int)uVar14 & 0xffffffffffffffe0;
  lVar18 = uVar15 + 4;
  iVar22 = cinfo->actual_number_of_colors;
  lVar21 = (long)iVar22;
  iVar27 = (int)uVar28;
  iVar29 = (int)uVar30;
  uVar31 = (uint)lVar18;
  if (lVar21 < 1) {
    lVar26 = 0x7fffffff;
  }
  else {
    uVar25 = (long)(int)uVar12 | 0x1c;
    uVar9 = (uint)uVar25;
    uVar40 = (long)(int)uVar13 | 0x1e;
    iVar20 = (int)uVar40;
    uVar35 = (long)(int)uVar14 | 0x1c;
    iVar10 = (int)uVar35;
    ppJVar5 = cinfo->colormap;
    pJVar6 = *ppJVar5;
    pJVar7 = ppJVar5[1];
    pJVar8 = ppJVar5[2];
    lVar26 = 0x7fffffff;
    lVar23 = 0;
    do {
      bVar1 = pJVar6[lVar23];
      uVar33 = (ulong)bVar1;
      if ((int)(uint)bVar1 < iVar27) {
        lVar16 = (uVar33 - uVar28) * 2;
        lVar16 = lVar16 * lVar16;
        uVar17 = uVar9;
      }
      else if ((int)uVar9 < (int)(uint)bVar1) {
        lVar16 = (uVar33 - uVar25) * 2;
        lVar16 = lVar16 * lVar16;
        uVar17 = uVar12 & 0xffffffe0 | 4;
      }
      else {
        uVar17 = uVar12 & 0xffffffe0 | 4;
        if ((uint)bVar1 <= iVar27 + uVar9 >> 1) {
          uVar17 = uVar9;
        }
        lVar16 = 0;
      }
      bVar1 = pJVar7[lVar23];
      uVar19 = (ulong)bVar1;
      if ((int)(uint)bVar1 < iVar29) {
        lVar39 = (uVar19 - uVar30) * 3;
        lVar16 = lVar16 + lVar39 * lVar39;
LAB_0010b952:
        uVar24 = uVar13 | 0x1e;
      }
      else if (iVar20 < (int)(uint)bVar1) {
        lVar39 = (uVar19 - uVar40) * 3;
        lVar16 = lVar16 + lVar39 * lVar39;
        uVar24 = uVar13 & 0xffffffe0 | 2;
      }
      else {
        uVar24 = uVar13 & 0xffffffe0 | 2;
        if ((uint)bVar1 <= (uint)(iVar29 + iVar20) >> 1) goto LAB_0010b952;
      }
      bVar1 = pJVar8[lVar23];
      uVar36 = (ulong)bVar1;
      if ((int)(uint)bVar1 < (int)uVar31) {
        lVar39 = uVar36 - lVar18;
        lVar16 = lVar16 + lVar39 * lVar39;
LAB_0010b997:
        uVar38 = uVar14 | 0x1c;
      }
      else {
        uVar38 = uVar31;
        if (iVar10 < (int)(uint)bVar1) {
          lVar39 = uVar36 - uVar35;
          lVar16 = lVar16 + lVar39 * lVar39;
        }
        else if ((uint)bVar1 <= uVar31 + iVar10 >> 1) goto LAB_0010b997;
      }
      lVar39 = (uVar33 - (long)(int)uVar17) * 2;
      lVar11 = (uVar19 - (long)(int)uVar24) * 3;
      lVar39 = (uVar36 - (long)(int)uVar38) * (uVar36 - (long)(int)uVar38) +
               lVar11 * lVar11 + lVar39 * lVar39;
      if (lVar26 <= lVar39) {
        lVar39 = lVar26;
      }
      lVar26 = lVar39;
      local_838[lVar23] = lVar16;
      lVar23 = lVar23 + 1;
    } while (lVar21 != lVar23);
  }
  local_9e8 = (int)uVar15;
  if (iVar22 < 1) {
    uVar12 = 0;
  }
  else {
    lVar18 = 0;
    uVar12 = 0;
    do {
      if (local_838[lVar18] <= lVar26) {
        lVar23 = (long)(int)uVar12;
        uVar12 = uVar12 + 1;
        abStack_938[lVar23] = (byte)lVar18;
      }
      lVar18 = lVar18 + 1;
    } while (lVar21 != lVar18);
  }
  lVar18 = 0;
  do {
    local_838[lVar18] = 0x7fffffff;
    lVar18 = lVar18 + 1;
  } while ((int)lVar18 != 0x80);
  if (0 < (int)uVar12) {
    uVar15 = 0;
    do {
      bVar1 = abStack_938[uVar15];
      ppJVar5 = cinfo->colormap;
      lVar21 = ((long)iVar27 - (ulong)(*ppJVar5)[bVar1]) * 2;
      bVar2 = ppJVar5[1][bVar1];
      lVar18 = ((long)iVar29 - (ulong)bVar2) * 3;
      bVar3 = ppJVar5[2][bVar1];
      lVar26 = (long)(int)uVar31 - (ulong)bVar3;
      lVar18 = lVar26 * lVar26 + lVar18 * lVar18 + lVar21 * lVar21;
      lVar21 = ((long)iVar27 - (ulong)(*ppJVar5)[bVar1]) * 0x40 + 0x100;
      iVar22 = 3;
      pbVar37 = local_9b8;
      plVar34 = local_838;
      do {
        iVar20 = 7;
        lVar26 = lVar18;
        lVar23 = ((long)iVar29 - (ulong)bVar2) * 0x48 + 0x90;
        do {
          lVar39 = 0;
          lVar16 = lVar26;
          do {
            if (lVar16 < *plVar34) {
              *plVar34 = lVar16;
              *pbVar37 = bVar1;
            }
            lVar16 = lVar16 + (long)local_9e8 * 0x10 + 0x80 + (ulong)bVar3 * -0x10 + lVar39;
            plVar34 = plVar34 + 1;
            pbVar37 = pbVar37 + 1;
            lVar39 = lVar39 + 0x80;
          } while ((int)lVar39 != 0x200);
          lVar26 = lVar26 + lVar23;
          lVar23 = lVar23 + 0x120;
          bVar41 = iVar20 != 0;
          iVar20 = iVar20 + -1;
        } while (bVar41);
        lVar18 = lVar18 + lVar21;
        lVar21 = lVar21 + 0x200;
        bVar41 = iVar22 != 0;
        iVar22 = iVar22 + -1;
      } while (bVar41);
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar12);
  }
  pbVar37 = local_9b8;
  uVar15 = 0;
  do {
    lVar18 = *(long *)(p_Var4 + (uVar15 | (long)(int)(c0 & 0xfffffffc)) * 8) +
             (long)(int)(c1 & 0xfffffff8) * 0x40 + (ulong)((uint)c2 >> 2) * 8;
    lVar21 = 0;
    do {
      pbVar32 = pbVar37;
      lVar26 = 0;
      do {
        *(ushort *)(lVar18 + lVar26 * 2) = pbVar32[lVar26] + 1;
        lVar26 = lVar26 + 1;
      } while (lVar26 != 4);
      lVar21 = lVar21 + 1;
      lVar18 = lVar18 + 0x40;
      pbVar37 = pbVar32 + 4;
    } while (lVar21 != 8);
    uVar15 = uVar15 + 1;
    pbVar37 = pbVar32 + 4;
  } while (uVar15 != 4);
  return;
}

Assistant:

LOCAL(void)
fill_inverse_cmap (j_decompress_ptr cinfo, int c0, int c1, int c2)
/* Fill the inverse-colormap entries in the update box that contains */
/* histogram cell c0/c1/c2.  (Only that one cell MUST be filled, but */
/* we can fill as many others as we wish.) */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  int minc0, minc1, minc2;	/* lower left corner of update box */
  int ic0, ic1, ic2;
  register JSAMPLE * cptr;	/* pointer into bestcolor[] array */
  register histptr cachep;	/* pointer into main cache array */
  /* This array lists the candidate colormap indexes. */
  JSAMPLE colorlist[MAXNUMCOLORS];
  int numcolors;		/* number of candidate colors */
  /* This array holds the actually closest colormap index for each cell. */
  JSAMPLE bestcolor[BOX_C0_ELEMS * BOX_C1_ELEMS * BOX_C2_ELEMS];

  /* Convert cell coordinates to update box ID */
  c0 >>= BOX_C0_LOG;
  c1 >>= BOX_C1_LOG;
  c2 >>= BOX_C2_LOG;

  /* Compute true coordinates of update box's origin corner.
   * Actually we compute the coordinates of the center of the corner
   * histogram cell, which are the lower bounds of the volume we care about.
   */
  minc0 = (c0 << BOX_C0_SHIFT) + ((1 << C0_SHIFT) >> 1);
  minc1 = (c1 << BOX_C1_SHIFT) + ((1 << C1_SHIFT) >> 1);
  minc2 = (c2 << BOX_C2_SHIFT) + ((1 << C2_SHIFT) >> 1);
  
  /* Determine which colormap entries are close enough to be candidates
   * for the nearest entry to some cell in the update box.
   */
  numcolors = find_nearby_colors(cinfo, minc0, minc1, minc2, colorlist);

  /* Determine the actually nearest colors. */
  find_best_colors(cinfo, minc0, minc1, minc2, numcolors, colorlist,
		   bestcolor);

  /* Save the best color numbers (plus 1) in the main cache array */
  c0 <<= BOX_C0_LOG;		/* convert ID back to base cell indexes */
  c1 <<= BOX_C1_LOG;
  c2 <<= BOX_C2_LOG;
  cptr = bestcolor;
  for (ic0 = 0; ic0 < BOX_C0_ELEMS; ic0++) {
    for (ic1 = 0; ic1 < BOX_C1_ELEMS; ic1++) {
      cachep = & histogram[c0+ic0][c1+ic1][c2];
      for (ic2 = 0; ic2 < BOX_C2_ELEMS; ic2++) {
	*cachep++ = (histcell) (GETJSAMPLE(*cptr++) + 1);
      }
    }
  }
}